

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O0

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,UInt32 u)

{
  StrWriter *this_local;
  UInt32 u_local;
  
  if ((this->style->numberFormat).radix == '\x10') {
    sprintx(&this->ptr,(ulong)u.raw,&this->style->numberFormat,8);
  }
  else {
    sprintd(&this->ptr,(ulong)u.raw,10);
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(UInt32 u)
{
    if (style.numberFormat.radix == 16) {
        sprintx(ptr, u.raw, style.numberFormat, 8);
    } else {
        sprintd(ptr, u.raw, 10);
    }
    return *this;
}